

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0091(SemanticModelTester *this)

{
  DeclarationCategory DVar1;
  SymbolKind SVar2;
  bool bVar3;
  TypeKind TVar4;
  BasicTypeKind BVar5;
  int iVar6;
  __tuple_element_t<0UL,_tuple<const_VariableAndOrFunctionDeclarationSyntax_*,_const_SemanticModel_*>_>
  *ppVVar7;
  size_type sVar8;
  ostream *poVar9;
  void *pvVar10;
  undefined8 uVar11;
  reference ppDVar12;
  undefined4 extraout_var;
  Lexeme *pLVar13;
  Type *pTVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string local_148;
  string local_128;
  FunctionDeclarationSymbol *local_108;
  FunctionDeclarationSymbol *funcDeclSym1;
  DeclarationSymbol *declSym1;
  string local_d8;
  ObjectDeclarationSymbol *local_b8;
  VariableDeclarationSymbol *varDeclSym0;
  DeclarationSymbol *declSym0;
  vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_> syms
  ;
  type *semaModel;
  type *varAndOrFunDeclNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"int x , y ( int z ) ;",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&varAndOrFunDeclNode + 7));
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&varAndOrFunDeclNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  ppVVar7 = std::
            get<0ul,psy::C::VariableAndOrFunctionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                      ((tuple<const_psy::C::VariableAndOrFunctionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                        *)local_20);
  syms.
  super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                get<1ul,psy::C::VariableAndOrFunctionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                          ((tuple<const_psy::C::VariableAndOrFunctionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                            *)local_20);
  SemanticModel::variablesAndOrFunctionsFor
            ((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              *)&declSym0,
             (SemanticModel *)
             *syms.
              super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar7);
  sVar8 = std::
          vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
          ::size((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                  *)&declSym0);
  if (sVar8 != 2) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    sVar8 = std::
            vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ::size((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                    *)&declSym0);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar8);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xe9);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  ppDVar12 = std::
             vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
             ::operator[]((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                           *)&declSym0,0);
  varDeclSym0 = (VariableDeclarationSymbol *)*ppDVar12;
  if (varDeclSym0 == (VariableDeclarationSymbol *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpression is NOT ");
    poVar9 = std::operator<<(poVar9,"true");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xec);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  DVar1 = DeclarationSymbol::category((DeclarationSymbol *)varDeclSym0);
  if (DVar1 != Object) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    DVar1 = DeclarationSymbol::category((DeclarationSymbol *)varDeclSym0);
    poVar9 = C::operator<<(poVar9,DVar1);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = C::operator<<(poVar9,Object);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xed);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  SVar2 = Symbol::kind((Symbol *)varDeclSym0);
  if (SVar2 != VariableDeclaration) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    SVar2 = Symbol::kind((Symbol *)varDeclSym0);
    poVar9 = C::operator<<(poVar9,SVar2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = C::operator<<(poVar9,VariableDeclaration);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xee);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  iVar6 = (*(varDeclSym0->super_ObjectDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
            _vptr_Symbol[0xd])();
  local_b8 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var,iVar6);
  pLVar13 = &ObjectDeclarationSymbol::name(local_b8)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_d8,pLVar13);
  bVar3 = std::operator==(&local_d8,"x");
  std::__cxx11::string::~string((string *)&local_d8);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pLVar13 = &ObjectDeclarationSymbol::name(local_b8)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_((string *)&declSym1,pLVar13);
    poVar9 = std::operator<<(poVar9,(string *)&declSym1);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = std::operator<<(poVar9,"x");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xf0);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&declSym1);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = ObjectDeclarationSymbol::type(local_b8);
  TVar4 = Type::kind(pTVar14);
  if (TVar4 != Basic) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = ObjectDeclarationSymbol::type(local_b8);
    TVar4 = Type::kind(pTVar14);
    poVar9 = ::operator<<(poVar9,TVar4);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = ::operator<<(poVar9,Basic);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xf1);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = ObjectDeclarationSymbol::type(local_b8);
  iVar6 = (*pTVar14->_vptr_Type[5])();
  BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar6));
  if (BVar5 != Int_S) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = ObjectDeclarationSymbol::type(local_b8);
    iVar6 = (*pTVar14->_vptr_Type[5])();
    BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar6));
    poVar9 = C::operator<<(poVar9,BVar5);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = C::operator<<(poVar9,Int_S);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xf2);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  ppDVar12 = std::
             vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
             ::operator[]((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                           *)&declSym0,1);
  funcDeclSym1 = (FunctionDeclarationSymbol *)*ppDVar12;
  if (funcDeclSym1 == (FunctionDeclarationSymbol *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpression is NOT ");
    poVar9 = std::operator<<(poVar9,"true");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xf5);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  DVar1 = DeclarationSymbol::category((DeclarationSymbol *)funcDeclSym1);
  if (DVar1 != Function) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    DVar1 = DeclarationSymbol::category(&funcDeclSym1->super_DeclarationSymbol);
    poVar9 = C::operator<<(poVar9,DVar1);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = C::operator<<(poVar9,Function);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xf6);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  SVar2 = Symbol::kind((Symbol *)funcDeclSym1);
  if (SVar2 != FunctionDeclaration) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    SVar2 = Symbol::kind((Symbol *)funcDeclSym1);
    poVar9 = C::operator<<(poVar9,SVar2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = C::operator<<(poVar9,FunctionDeclaration);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xf7);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  iVar6 = (*(funcDeclSym1->super_DeclarationSymbol).super_Symbol._vptr_Symbol[9])();
  local_108 = (FunctionDeclarationSymbol *)CONCAT44(extraout_var_02,iVar6);
  if (local_108 == (FunctionDeclarationSymbol *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpression is NOT ");
    poVar9 = std::operator<<(poVar9,"true");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0xf9);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pLVar13 = &FunctionDeclarationSymbol::name(local_108)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_128,pLVar13);
  bVar3 = std::operator==(&local_128,"y");
  std::__cxx11::string::~string((string *)&local_128);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    pTVar14 = FunctionDeclarationSymbol::type(local_108);
    TVar4 = Type::kind(pTVar14);
    if (TVar4 != Function) {
      poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
      pTVar14 = FunctionDeclarationSymbol::type(local_108);
      TVar4 = Type::kind(pTVar14);
      poVar9 = ::operator<<(poVar9,TVar4);
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
      poVar9 = ::operator<<(poVar9,Function);
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,"\t\t");
      poVar9 = std::operator<<(poVar9,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar9 = std::operator<<(poVar9,":");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,0xfb);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      uVar11 = __cxa_allocate_exception(1);
      __cxa_throw(uVar11,&TestFailed::typeinfo,0);
    }
    std::
    vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>::
    ~vector((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
             *)&declSym0);
    return;
  }
  poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
  poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
  pLVar13 = &FunctionDeclarationSymbol::name(local_108)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_148,pLVar13);
  poVar9 = std::operator<<(poVar9,(string *)&local_148);
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
  poVar9 = std::operator<<(poVar9,"y");
  poVar9 = std::operator<<(poVar9,"\n");
  poVar9 = std::operator<<(poVar9,"\t\t");
  poVar9 = std::operator<<(poVar9,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                          );
  poVar9 = std::operator<<(poVar9,":");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,0xfa);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_148);
  uVar11 = __cxa_allocate_exception(1);
  __cxa_throw(uVar11,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0091()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("int x , y ( int z ) ;");

    auto syms = semaModel->variablesAndOrFunctionsFor(varAndOrFunDeclNode);
    PSY_EXPECT_EQ_INT(syms.size(), 2);

    const DeclarationSymbol* declSym0 = syms[0];
    PSY_EXPECT_TRUE(declSym0);
    PSY_EXPECT_EQ_ENU(declSym0->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym0->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym0 = declSym0->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym0->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(varDeclSym0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(varDeclSym0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    const DeclarationSymbol* declSym1 = syms[1];
    PSY_EXPECT_TRUE(declSym1);
    PSY_EXPECT_EQ_ENU(declSym1->category(), DeclarationCategory::Function, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym1->kind(), SymbolKind::FunctionDeclaration, SymbolKind);
    const FunctionDeclarationSymbol* funcDeclSym1 = declSym1->asFunctionDeclaration();
    PSY_EXPECT_TRUE(funcDeclSym1);
    PSY_EXPECT_EQ_STR(funcDeclSym1->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(funcDeclSym1->type()->kind(), TypeKind::Function, TypeKind);
}